

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_statemach_act(connectdata *conn)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  uint *puVar1;
  imapstate iVar2;
  curl_usessl cVar3;
  int iVar4;
  _Bool _Var5;
  CURLcode CVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  curl_socket_t sockfd;
  void *pvVar11;
  char *pcVar12;
  Curl_easy *pCVar13;
  long lVar14;
  Curl_easy *pCVar15;
  smtp_conn *smtpc;
  int smtpcode;
  Curl_easy *local_60;
  void *local_58;
  Curl_easy *local_50;
  saslprogress local_48;
  undefined4 uStack_44;
  SASL *local_40;
  size_t nread;
  
  sockfd = conn->sock[0];
  pCVar15 = conn->data;
  nread = 0;
  if ((conn->proto).imapc.state == IMAP_AUTHENTICATE) {
    CVar6 = smtp_perform_upgrade_tls(conn);
    return CVar6;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar6 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar6;
  }
  local_40 = (SASL *)&(conn->proto).imapc.sasl.state;
  local_50 = pCVar15;
  do {
    CVar6 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,&smtpcode,&nread);
    iVar4 = smtpcode;
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    iVar2 = (conn->proto).imapc.state;
    if (smtpcode != 1 && iVar2 != IMAP_APPEND_FINAL) {
      (pCVar15->info).httpcode = smtpcode;
    }
    if (smtpcode == 0) {
      return CURLE_OK;
    }
    switch(iVar2) {
    case IMAP_SERVERGREET:
      if (99 < smtpcode - 200U) {
        Curl_failf(conn->data,"Got unexpected smtp-server response: %d",(ulong)(uint)smtpcode);
        return CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      CVar6 = smtp_perform_ehlo(conn);
      break;
    case IMAP_CAPABILITY:
      pCVar13 = conn->data;
      if (0xffffff9b < smtpcode - 300U || smtpcode == 1) {
        local_60 = pCVar13;
        sVar9 = strlen((pCVar13->state).buffer);
        pcVar12 = (local_60->state).buffer + 4;
        uVar10 = sVar9 - 4;
        if (uVar10 < 8) {
          if (3 < uVar10) goto LAB_0013b808;
        }
        else if (*(long *)pcVar12 == 0x534c545452415453) {
          (conn->proto).ftpc.transfertype = '\x01';
        }
        else {
LAB_0013b808:
          if (*(int *)pcVar12 == 0x455a4953) {
            (conn->proto).imapc.resptag[1] = '\x01';
          }
          else if ((4 < uVar10) && (iVar7 = bcmp(pcVar12,"AUTH ",5), iVar7 == 0)) {
            (conn->proto).imapc.resptag[2] = '\x01';
            pcVar12 = (local_60->state).buffer + 9;
            lVar14 = sVar9 - 9;
            do {
              lVar14 = -lVar14;
              while( true ) {
                if (lVar14 == 0) goto LAB_0013b93c;
                if ((0x20 < (ulong)(byte)*pcVar12) ||
                   ((0x100002600U >> ((ulong)(byte)*pcVar12 & 0x3f) & 1) == 0)) break;
                pcVar12 = pcVar12 + 1;
                lVar14 = lVar14 + 1;
              }
              pvVar11 = (void *)0x0;
              while ((local_58 = (void *)-lVar14, lVar14 + (long)pvVar11 != 0 &&
                     ((0x20 < (ulong)(byte)pcVar12[(long)pvVar11] ||
                      (local_58 = pvVar11,
                      (0x100002600U >> ((ulong)(byte)pcVar12[(long)pvVar11] & 0x3f) & 1) == 0))))) {
                pvVar11 = (void *)((long)pvVar11 + 1);
              }
              uVar8 = Curl_sasl_decode_mech(pcVar12,(size_t)local_58,(size_t *)&local_48);
              if ((uVar8 != 0) && ((void *)CONCAT44(uStack_44,local_48) == local_58)) {
                puVar1 = (uint *)((long)&conn->proto + 0x8c);
                *puVar1 = *puVar1 | uVar8;
              }
              pcVar12 = pcVar12 + (long)local_58;
              lVar14 = -(lVar14 + (long)local_58);
            } while( true );
          }
        }
LAB_0013b93c:
        pCVar15 = local_50;
        if (iVar4 != 1) {
          cVar3 = (local_60->set).use_ssl;
          if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
            if ((conn->proto).ftpc.transfertype == '\x01') {
              CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STARTTLS");
              iVar2 = IMAP_UPGRADETLS;
              goto LAB_0013b7de;
            }
            if (cVar3 != CURLUSESSL_TRY) {
              Curl_failf(local_60,"STARTTLS not supported.");
              return CURLE_USE_SSL_FAILED;
            }
          }
LAB_0013b738:
          CVar6 = smtp_perform_authentication(conn);
          break;
        }
        goto LAB_0013b905;
      }
      if ((CURLUSESSL_TRY < (pCVar13->set).use_ssl) && (conn->ssl[0].use != true))
      goto LAB_0013ba95;
      *(undefined4 *)((long)&conn->proto + 0x94) = 0;
      CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"HELO %s",(conn->proto).ftpc.dirs);
      iVar2 = IMAP_STARTTLS;
LAB_0013b7de:
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      (conn->proto).imapc.state = iVar2;
      goto LAB_0013b912;
    case IMAP_STARTTLS:
      if (99 < smtpcode - 200U) {
        pCVar13 = conn->data;
LAB_0013ba95:
        Curl_failf(pCVar13,"Remote access denied: %d",(ulong)(uint)smtpcode);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
    default:
switchD_0013b54f_caseD_5:
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    case IMAP_UPGRADETLS:
      if (smtpcode != 0xdc) {
        if ((conn->data->set).use_ssl != CURLUSESSL_TRY) {
          Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)(uint)smtpcode);
          return CURLE_USE_SSL_FAILED;
        }
        goto LAB_0013b738;
      }
      CVar6 = smtp_perform_upgrade_tls(conn);
      break;
    case IMAP_LOGIN:
      pCVar13 = conn->data;
      CVar6 = Curl_sasl_continue(local_40,conn,smtpcode,&local_48);
      if (CVar6 == CURLE_OK) {
        if (local_48 == SASL_IDLE) {
          Curl_failf(pCVar13,"Authentication cancelled");
          CVar6 = CURLE_LOGIN_DENIED;
        }
        else {
          CVar6 = CURLE_OK;
          if (local_48 == SASL_DONE) {
            (conn->proto).imapc.state = IMAP_STOP;
          }
        }
      }
      break;
    case IMAP_LIST:
      local_60 = (Curl_easy *)CONCAT44(local_60._4_4_,sockfd);
      pCVar15 = conn->data;
      pvVar11 = (pCVar15->req).protop;
      pcVar12 = (pCVar15->state).buffer;
      sVar9 = strlen(pcVar12);
      local_58 = pvVar11;
      if ((iVar4 - 300U < 0xffffff9c) && (*(long *)((long)pvVar11 + 0x10) != 0)) {
        if ((iVar4 != 1) && (iVar4 != 0x229)) {
LAB_0013ba3d:
          Curl_failf(pCVar15,"Command failed: %d",(ulong)(uint)iVar4);
          return CURLE_RECV_ERROR;
        }
      }
      else if ((iVar4 - 300U < 0xffffff9c) &&
              ((iVar4 != 1 && (*(long *)((long)pvVar11 + 0x10) == 0)))) goto LAB_0013ba3d;
      CVar6 = CURLE_OK;
      if ((pCVar15->set).opt_no_body == false) {
        pcVar12[sVar9] = '\n';
        CVar6 = Curl_client_write(conn,1,pcVar12,sVar9 + 1);
        pcVar12[sVar9] = '\0';
      }
      pCVar15 = local_50;
      sockfd = (curl_socket_t)local_60;
      if (iVar4 != 1) {
        if ((*(long *)((long)local_58 + 0x10) == 0) ||
           (lVar14 = *(long *)(*(long *)((long)local_58 + 0x10) + 8),
           *(long *)((long)local_58 + 0x10) = lVar14, lVar14 == 0)) {
          (conn->proto).imapc.state = IMAP_STOP;
        }
        else {
          CVar6 = smtp_perform_command(conn);
        }
      }
      break;
    case IMAP_SELECT:
      if (99 < smtpcode - 200U) {
        pCVar13 = conn->data;
        pcVar12 = "MAIL failed: %d";
LAB_0013ba5c:
        Curl_failf(pCVar13,pcVar12,(ulong)(uint)smtpcode);
        return CURLE_SEND_ERROR;
      }
      goto LAB_0013b629;
    case IMAP_FETCH:
      pCVar13 = conn->data;
      if (99 < smtpcode - 200U) {
        pcVar12 = "RCPT failed: %d";
        goto LAB_0013ba5c;
      }
      pvVar11 = (pCVar13->req).protop;
      lVar14 = *(long *)(*(long *)((long)pvVar11 + 0x10) + 8);
      *(long *)((long)pvVar11 + 0x10) = lVar14;
      if (lVar14 == 0) {
        CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","DATA");
        iVar2 = IMAP_FETCH_FINAL;
        goto LAB_0013b7de;
      }
LAB_0013b629:
      CVar6 = smtp_perform_rcpt_to(conn);
      break;
    case IMAP_FETCH_FINAL:
      pCVar13 = conn->data;
      if (smtpcode != 0x162) {
        pcVar12 = "DATA failed: %d";
        goto LAB_0013ba5c;
      }
      Curl_pgrsSetUploadSize(pCVar13,(pCVar13->state).infilesize);
      Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
      goto switchD_0013b54f_caseD_5;
    case IMAP_APPEND:
      (conn->proto).imapc.state = IMAP_STOP;
      if (smtpcode != 0xfa) {
        return CURLE_RECV_ERROR;
      }
      return CURLE_OK;
    }
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
LAB_0013b905:
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
LAB_0013b912:
    _Var5 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var5) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode smtp_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct Curl_easy *data = conn->data;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH:
      result = smtp_state_auth_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}